

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_destSize_generic
              (void *ctx,char *src,char *dst,int *srcSizePtr,int targetDstSize,tableType_t tableType
              )

{
  uint uVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  U16 *hashTable;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint searchMatchNb;
  char *__n;
  int iVar11;
  int *p;
  short *psVar12;
  BYTE *e;
  ulong uVar13;
  int *piVar14;
  short *psVar15;
  int *p_00;
  int *piVar16;
  int *local_98;
  short *local_90;
  int local_88;
  int local_70;
  
  uVar1 = *srcSizePtr;
  local_70 = 0;
  if ((uVar1 < 0x7e000001 && 0 < targetDstSize) &&
     (local_70 = 0, tableType != byU16 || uVar1 < 0x1000b)) {
    pcVar7 = dst + targetDstSize;
    p = (int *)src;
    psVar12 = (short *)dst;
    if (0xc < uVar1) {
      *srcSizePtr = 0;
      LZ4_putPosition((BYTE *)src,ctx,tableType,(BYTE *)src);
      p_00 = (int *)(src + 1);
      uVar6 = LZ4_hashPosition(p_00,tableType);
      local_98 = (int *)src;
      local_90 = (short *)dst;
LAB_0016cc17:
      uVar9 = 0x40;
      uVar8 = 1;
      do {
        piVar16 = (int *)(uVar8 + (long)p_00);
        p = local_98;
        psVar12 = local_90;
        if (src + (long)(int)uVar1 + -0xc < piVar16) break;
        uVar8 = (ulong)uVar6;
        if (tableType == byU32) {
          uVar13 = (ulong)*(uint *)((long)ctx + uVar8 * 4);
        }
        else {
          uVar13 = (ulong)*(ushort *)((long)ctx + uVar8 * 2);
        }
        piVar14 = (int *)(src + uVar13);
        uVar6 = LZ4_hashPosition(piVar16,tableType);
        if (tableType == byU16) {
          *(short *)((long)ctx + uVar8 * 2) = (short)((long)p_00 - (long)src);
LAB_0016cc8b:
          if (*piVar14 == *p_00) goto LAB_0016cc9d;
        }
        else {
          *(int *)((long)ctx + uVar8 * 4) = (int)((long)p_00 - (long)src);
          if (p_00 <= (int *)((long)piVar14 + 0xffff)) goto LAB_0016cc8b;
        }
        uVar8 = uVar9 >> 6;
        uVar9 = (ulong)((int)uVar9 + 1);
        p_00 = piVar16;
      } while( true );
    }
LAB_0016cb15:
    __n = src + ((long)(int)uVar1 - (long)p);
    if (pcVar7 < (char *)((long)psVar12 + (long)(__n + (ulong)(__n + 0xf0) / 0xff + 1))) {
      __n = pcVar7 + (~(ulong)psVar12 - (ulong)(pcVar7 + ~(ulong)psVar12 + 0xf0) / 0xff);
    }
    if (__n < (char *)0xf) {
      *(char *)psVar12 = (char)__n << 4;
      psVar12 = (short *)((long)psVar12 + 1);
    }
    else {
      *(char *)psVar12 = -0x10;
      psVar12 = psVar12 + 1;
      for (pcVar7 = __n + -0xf; (char *)0xfe < pcVar7; pcVar7 = pcVar7 + -0xff) {
        *(char *)((long)psVar12 + -1) = -1;
        psVar12 = (short *)((long)psVar12 + 1);
      }
      *(char *)((long)psVar12 + -1) = (char)pcVar7;
    }
    memcpy(psVar12,p,(size_t)__n);
    local_88 = (int)src;
    *srcSizePtr = ((int)p + (int)__n) - local_88;
    local_70 = (int)dst;
    local_70 = ((int)psVar12 + (int)__n) - local_70;
  }
  return local_70;
LAB_0016cc9d:
  lVar3 = 0;
  cVar4 = (char)p_00 * '\x10' + (char)local_98 * -0x10;
  do {
    cVar5 = cVar4;
    lVar10 = lVar3;
    piVar16 = (int *)((long)piVar14 + lVar10);
    if (((int *)(lVar10 + (long)p_00) <= local_98) || (piVar16 <= src)) break;
    lVar3 = lVar10 + -1;
    cVar4 = cVar5 + -0x10;
  } while (*(char *)((long)p_00 + lVar10 + -1) == *(char *)((long)piVar14 + lVar10 + -1));
  iVar11 = (int)p_00 - (int)local_98;
  iVar2 = (int)lVar10;
  uVar8 = (ulong)(uint)(iVar11 + iVar2);
  uVar6 = iVar11 + iVar2;
  if (dst + (long)targetDstSize + -0xb <
      (char *)((long)local_90 + uVar8 + (ulong)(uVar6 + 0xf0) / 0xff + 1)) goto LAB_0016cb15;
  if (uVar6 < 0xf) {
    psVar12 = (short *)((long)local_90 + 1);
    *(char *)local_90 = cVar5;
  }
  else {
    *(char *)local_90 = -0x10;
    psVar12 = local_90 + 1;
    for (uVar6 = (iVar2 + ((int)p_00 - (int)local_98)) - 0xf; 0xfe < uVar6; uVar6 = uVar6 - 0xff) {
      *(char *)((long)psVar12 + -1) = -1;
      psVar12 = (short *)((long)psVar12 + 1);
    }
    *(char *)((long)psVar12 + -1) = (char)uVar6;
  }
  psVar15 = (short *)(uVar8 + (long)psVar12);
  do {
    *(undefined8 *)psVar12 = *(undefined8 *)local_98;
    psVar12 = psVar12 + 4;
    local_98 = local_98 + 2;
    p = (int *)(lVar10 + (long)p_00);
  } while (psVar12 < psVar15);
  while( true ) {
    local_98 = p;
    *psVar15 = (short)local_98 - (short)piVar16;
    psVar12 = psVar15 + 1;
    uVar6 = LZ4_count((BYTE *)(local_98 + 1),(BYTE *)(piVar16 + 1),
                      (BYTE *)(src + (long)(int)uVar1 + -5));
    uVar8 = ((long)(dst + (long)targetDstSize + -6) - (long)psVar12) * 0xff + 0xe;
    if ((char *)((long)psVar15 + ((ulong)uVar6 + 0xf0) / 0xff + 2) <= dst + (long)targetDstSize + -6
       ) {
      uVar8 = (ulong)uVar6;
    }
    if (uVar8 < 0xf) {
      *(char *)local_90 = (char)*local_90 + (char)uVar8;
    }
    else {
      *(char *)local_90 = (char)*local_90 + '\x0f';
      psVar12 = (short *)((long)psVar15 + 3);
      for (uVar9 = uVar8 - 0xf; 0xfe < uVar9; uVar9 = uVar9 - 0xff) {
        *(char *)((long)psVar12 + -1) = -1;
        psVar12 = (short *)((long)psVar12 + 1);
      }
      *(char *)((long)psVar12 + -1) = (char)uVar9;
    }
    p = (int *)((long)local_98 + uVar8 + 4);
    if ((src + (long)(int)uVar1 + -0xc < p) || (dst + (long)targetDstSize + -0xc < psVar12))
    goto LAB_0016cb15;
    LZ4_putPosition((BYTE *)((long)local_98 + uVar8 + 2),ctx,tableType,(BYTE *)src);
    piVar16 = (int *)LZ4_getPosition((BYTE *)p,ctx,tableType,(BYTE *)src);
    LZ4_putPosition((BYTE *)p,ctx,tableType,(BYTE *)src);
    local_90 = psVar12;
    if (((int *)((long)piVar16 + 0xffffU) < p) || (*piVar16 != *p)) break;
    psVar15 = (short *)((long)psVar12 + 1);
    *(char *)psVar12 = '\0';
  }
  p_00 = (int *)((long)local_98 + uVar8 + 5);
  uVar6 = LZ4_hashPosition(p_00,tableType);
  local_98 = p;
  goto LAB_0016cc17;
}

Assistant:

static int LZ4_compress_destSize_generic(
                       void* const ctx,
                 const char* const src,
                       char* const dst,
                       int*  const srcSizePtr,
                 const int targetDstSize,
                 const tableType_t tableType)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* base = (const BYTE*) src;
    const BYTE* lowLimit = (const BYTE*) src;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + *srcSizePtr;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = iend - LASTLITERALS;

    BYTE* op = (BYTE*) dst;
    BYTE* const oend = op + targetDstSize;
    BYTE* const oMaxLit = op + targetDstSize - 2 /* offset */ - 8 /* because 8+MINMATCH==MFLIMIT */ - 1 /* token */;
    BYTE* const oMaxMatch = op + targetDstSize - (LASTLITERALS + 1 /* token */);
    BYTE* const oMaxSeq = oMaxLit - 1 /* token */;

    U32 forwardH;


    /* Init conditions */
    if (targetDstSize < 1) return 0;                                     /* Impossible to store anything */
    if ((U32)*srcSizePtr > (U32)LZ4_MAX_INPUT_SIZE) return 0;            /* Unsupported input size, too large (or negative) */
    if ((tableType == byU16) && (*srcSizePtr>=LZ4_64Klimit)) return 0;   /* Size too large (not within 64K limit) */
    if (*srcSizePtr<LZ4_minLength) goto _last_literals;                  /* Input too small, no compression (all literals) */

    /* First Byte */
    *srcSizePtr = 0;
    LZ4_putPosition(ip, ctx, tableType, base);
    ip++; forwardH = LZ4_hashPosition(ip, tableType);

    /* Main Loop */
    for ( ; ; )
    {
        const BYTE* match;
        BYTE* token;
        {
            const BYTE* forwardIp = ip;
            unsigned step = 1;
            unsigned searchMatchNb = 1 << LZ4_skipTrigger;

            /* Find a match */
            do {
                U32 h = forwardH;
                ip = forwardIp;
                forwardIp += step;
                step = (searchMatchNb++ >> LZ4_skipTrigger);

                if (unlikely(forwardIp > mflimit))
                    goto _last_literals;

                match = LZ4_getPositionOnHash(h, ctx, tableType, base);
                forwardH = LZ4_hashPosition(forwardIp, tableType);
                LZ4_putPositionOnHash(ip, h, ctx, tableType, base);

            } while ( ((tableType==byU16) ? 0 : (match + MAX_DISTANCE < ip))
                || (LZ4_read32(match) != LZ4_read32(ip)) );
        }

        /* Catch up */
        while ((ip>anchor) && (match > lowLimit) && (unlikely(ip[-1]==match[-1]))) { ip--; match--; }

        {
            /* Encode Literal length */
            unsigned litLength = (unsigned)(ip - anchor);
            token = op++;
            if (op + ((litLength+240)/255) + litLength > oMaxLit)
            {
                /* Not enough space for a last match */
                op--;
                goto _last_literals;
            }
            if (litLength>=RUN_MASK)
            {
                unsigned len = litLength - RUN_MASK;
                *token=(RUN_MASK<<ML_BITS);
                for(; len >= 255 ; len-=255) *op++ = 255;
                *op++ = (BYTE)len;
            }
            else *token = (BYTE)(litLength<<ML_BITS);

            /* Copy Literals */
            LZ4_wildCopy(op, anchor, op+litLength);
            op += litLength;
        }

_next_match:
        /* Encode Offset */
        LZ4_writeLE16(op, (U16)(ip-match)); op+=2;

        /* Encode MatchLength */
        {
            size_t matchLength;

            matchLength = LZ4_count(ip+MINMATCH, match+MINMATCH, matchlimit);

            if (op + ((matchLength+240)/255) > oMaxMatch)
            {
                /* Match description too long : reduce it */
                matchLength = (15-1) + (oMaxMatch-op) * 255;
            }
            //printf("offset %5i, matchLength%5i \n", (int)(ip-match), matchLength + MINMATCH);
            ip += MINMATCH + matchLength;

            if (matchLength>=ML_MASK)
            {
                *token += ML_MASK;
                matchLength -= ML_MASK;
                while (matchLength >= 255) { matchLength-=255; *op++ = 255; }
                *op++ = (BYTE)matchLength;
            }
            else *token += (BYTE)(matchLength);
        }

        anchor = ip;

        /* Test end of block */
        if (ip > mflimit) break;
        if (op > oMaxSeq) break;

        /* Fill table */
        LZ4_putPosition(ip-2, ctx, tableType, base);

        /* Test next position */
        match = LZ4_getPosition(ip, ctx, tableType, base);
        LZ4_putPosition(ip, ctx, tableType, base);
        if ( (match+MAX_DISTANCE>=ip)
            && (LZ4_read32(match)==LZ4_read32(ip)) )
        { token=op++; *token=0; goto _next_match; }

        /* Prepare next loop */
        forwardH = LZ4_hashPosition(++ip, tableType);
    }

_last_literals:
    /* Encode Last Literals */
    {
        size_t lastRunSize = (size_t)(iend - anchor);
        if (op + 1 /* token */ + ((lastRunSize+240)/255) /* litLength */ + lastRunSize /* literals */ > oend)
        {
            /* adapt lastRunSize to fill 'dst' */
            lastRunSize  = (oend-op) - 1;
            lastRunSize -= (lastRunSize+240)/255;
        }
        ip = anchor + lastRunSize;

        if (lastRunSize >= RUN_MASK)
        {
            size_t accumulator = lastRunSize - RUN_MASK;
            *op++ = RUN_MASK << ML_BITS;
            for(; accumulator >= 255 ; accumulator-=255) *op++ = 255;
            *op++ = (BYTE) accumulator;
        }
        else
        {
            *op++ = (BYTE)(lastRunSize<<ML_BITS);
        }
        memcpy(op, anchor, lastRunSize);
        op += lastRunSize;
    }

    /* End */
    *srcSizePtr = (int) (((const char*)ip)-src);
    return (int) (((char*)op)-dst);
}